

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.h
# Opt level: O2

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestPartResult
          (PrettyUnitTestResultPrinter *this,TestPartResult *result)

{
  Message *pMVar1;
  int in_ECX;
  internal *this_00;
  ostream *poVar2;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  pointer local_68;
  char *local_60;
  string local_58;
  string local_38;
  
  if ((result->type_ != kSuccess) && (result->type_ != kSkip)) {
    Message::Message((Message *)&local_70);
    this_00 = (internal *)(result->file_name_)._M_string_length;
    if (this_00 != (internal *)0x0) {
      this_00 = (internal *)(result->file_name_)._M_dataplus._M_p;
    }
    FormatFileLocation_abi_cxx11_
              (&local_38,this_00,(char *)(ulong)(uint)result->line_number_,in_ECX);
    poVar2 = (ostream *)
             ((long)local_70._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 0x10);
    std::operator<<(poVar2,(string *)&local_38);
    std::operator<<(poVar2," ");
    if ((ulong)result->type_ < 4) {
      local_60 = &DAT_001d4678 + *(int *)(&DAT_001d4678 + (ulong)result->type_ * 4);
    }
    else {
      local_60 = "Unknown result type";
    }
    pMVar1 = Message::operator<<((Message *)&local_70,&local_60);
    local_68 = (result->message_)._M_dataplus._M_p;
    pMVar1 = Message::operator<<(pMVar1,&local_68);
    Message::GetString_abi_cxx11_(&local_58,pMVar1);
    std::__cxx11::string::_M_dispose();
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_70._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_70._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
    puts(local_58._M_dataplus._M_p);
    fflush(_stdout);
    std::__cxx11::string::_M_dispose();
    fflush(_stdout);
  }
  return;
}

Assistant:

Type type() const { return type_; }